

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O0

void __thiscall RK_Individual::imprimePesos(RK_Individual *this)

{
  int iVar1;
  int local_14;
  int i;
  RK_Individual *this_local;
  
  printf("pesos {");
  local_14 = 0;
  while( true ) {
    iVar1 = getNumEdges(this);
    if (iVar1 <= local_14) break;
    printf("%.2f, ",this->weights[local_14]);
    local_14 = local_14 + 1;
  }
  printf("}\n");
  return;
}

Assistant:

void RK_Individual::imprimePesos(){
    printf("pesos {");
    for(int i=0; i<this->getNumEdges(); i++)
        printf("%.2f, ", this->weights[i]);
    printf("}\n");
}